

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  undefined4 uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io1;
  TValue *to;
  TValue *fr;
  int toidx_local;
  int fromidx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,fromidx);
  pTVar3 = index2addr(L,toidx);
  pTVar3->value_ = pTVar2->value_;
  uVar1 = *(undefined4 *)&pTVar2->field_0xc;
  pTVar3->tt_ = pTVar2->tt_;
  *(undefined4 *)&pTVar3->field_0xc = uVar1;
  if ((((toidx < -0xf4628) && ((pTVar2->tt_ & 0x40U) != 0)) &&
      ((((L->ci->func->value_).gc)->marked & 4) != 0)) && ((((pTVar2->value_).gc)->marked & 3) != 0)
     ) {
    luaC_barrier_(L,(L->ci->func->value_).gc,(pTVar2->value_).gc);
  }
  return;
}

Assistant:

LUA_API void lua_copy(lua_State *L, int fromidx, int toidx) {
    TValue *fr, *to;
    lua_lock(L);
    fr = index2addr(L, fromidx);
    to = index2addr(L, toidx);
    api_checkvalidindex(L, to);
    setobj(L, to, fr);
    if (isupvalue(toidx))  /* function upvalue? */
        luaC_barrier(L, clCvalue(L->ci->func), fr);
    /* LUA_REGISTRYINDEX does not need gc barrier
       (collector revisits it before finishing collection) */
    lua_unlock(L);
}